

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O0

void __thiscall sim_sequential_Test::TestBody(sim_sequential_Test *this)

{
  undefined1 *this_00;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  undefined1 var [8];
  bool bVar1;
  int iVar2;
  Generator *pGVar3;
  Var *pVVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar6;
  unsigned_long *lhs;
  char *in_R9;
  optional<unsigned_long> oVar7;
  optional<unsigned_long> value_00;
  optional<unsigned_long> value_01;
  AssertHelper local_698;
  Message local_690;
  undefined1 local_688 [8];
  AssertionResult gtest_ar;
  AssertHelper local_658;
  Message local_650;
  bool local_641;
  undefined1 local_640 [8];
  AssertionResult gtest_ar__2;
  undefined4 uStack_628;
  int local_61c;
  undefined1 local_618 [12];
  int local_604;
  undefined1 local_600 [12];
  string local_5f0;
  AssertHelper local_5d0;
  Message local_5c8;
  bool local_5b9;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar__1;
  undefined4 uStack_5a0;
  int local_594;
  undefined1 local_590 [12];
  string local_580;
  AssertHelper local_560;
  Message local_558;
  bool local_549;
  undefined1 local_548 [8];
  AssertionResult gtest_ar_;
  optional<unsigned_long> res;
  unsigned_long local_520;
  iterator local_518;
  size_type local_510;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_508;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_4f0;
  uint local_4cc;
  undefined1 local_4c8 [4];
  uint32_t value;
  Simulator sim;
  shared_ptr<kratos::Stmt> local_310;
  undefined1 local_300 [32];
  enable_shared_from_this<kratos::Var> local_2e0;
  EventEdgeType local_2cc;
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> local_2c8;
  undefined1 local_2b0 [8];
  shared_ptr<kratos::SequentialStmtBlock> seq;
  string local_298;
  undefined1 local_278 [8];
  Var *c;
  undefined1 local_268 [16];
  pointer local_258;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_250;
  allocator<char> local_231;
  string local_230;
  Var *local_210;
  Var *b;
  _Hash_node_base local_200;
  __node_base local_1f8;
  size_type local_1f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  allocator<char> local_1c9;
  string local_1c8;
  Var *local_1a8;
  Var *a;
  string local_198;
  Var *local_178;
  Var *clk;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod;
  Context context;
  sim_sequential_Test *this_local;
  
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  pGVar3 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"clk",(allocator<char> *)((long)&a + 7));
  pVVar4 = kratos::Generator::var(pGVar3,&local_198,1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&a + 7));
  pGVar3 = local_138;
  local_178 = pVVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"a",&local_1c9);
  local_200._M_nxt._0_4_ = 2;
  local_200._M_nxt._4_4_ = 2;
  local_1f8._M_nxt = &local_200;
  local_1f0 = 2;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&b + 7));
  __l_01._M_len = local_1f0;
  __l_01._M_array = (iterator)local_1f8._M_nxt;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1e8,__l_01,(allocator<unsigned_int> *)((long)&b + 7));
  pVVar4 = kratos::Generator::var(pGVar3,&local_1c8,4,&local_1e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1e8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&b + 7));
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  pGVar3 = local_138;
  local_1a8 = pVVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"b",&local_231);
  local_268._0_4_ = StmtKind;
  local_268._4_4_ = 2;
  local_268._8_8_ = local_268;
  local_258 = (pointer)0x2;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&c + 7));
  __l_00._M_len = (size_type)local_258;
  __l_00._M_array = (iterator)local_268._8_8_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_250,__l_00,(allocator<unsigned_int> *)((long)&c + 7));
  pVVar4 = kratos::Generator::var(pGVar3,&local_230,4,&local_250);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_250);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&c + 7));
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  pGVar3 = local_138;
  local_210 = pVVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"c",
             (allocator<char> *)
             ((long)&seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  pVVar4 = kratos::Generator::var(pGVar3,&local_298,4);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  local_278 = (undefined1  [8])pVVar4;
  kratos::Generator::sequential((Generator *)local_2b0);
  peVar5 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_2b0);
  local_2cc = Posedge;
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_2e0);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>,_true>
            (&local_2c8,&local_2cc,(shared_ptr<kratos::Var> *)&local_2e0);
  kratos::SequentialStmtBlock::add_condition(peVar5,&local_2c8);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::~pair(&local_2c8);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_2e0);
  peVar5 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_2b0);
  var = local_278;
  iVar2 = (*(local_1a8->super_IRNode)._vptr_IRNode[9])(local_1a8,1);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x48))
            ((long *)CONCAT44(extraout_var,iVar2),1);
  kratos::Var::assign((Var *)local_300,(Var *)var);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_300 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_300);
  kratos::StmtBlock::add_stmt
            (&peVar5->super_StmtBlock,(shared_ptr<kratos::Stmt> *)(local_300 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_300 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_300);
  peVar5 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_2b0);
  kratos::Var::assign((Var *)&sim.simulation_depth_,local_1a8);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_310,(shared_ptr<kratos::AssignStmt> *)&sim.simulation_depth_);
  kratos::StmtBlock::add_stmt(&peVar5->super_StmtBlock,&local_310);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_310);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr
            ((shared_ptr<kratos::AssignStmt> *)&sim.simulation_depth_);
  kratos::Simulator::Simulator((Simulator *)local_4c8,local_138);
  local_4cc = 5;
  iVar2 = (*(local_210->super_IRNode)._vptr_IRNode[9])(local_210,1);
  pVVar4 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x48))
                            ((long *)CONCAT44(extraout_var_00,iVar2),1);
  local_520 = 5;
  local_518 = &local_520;
  local_510 = 1;
  this_00 = &res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>.field_0xf;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)this_00);
  __l._M_len = local_510;
  __l._M_array = local_518;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_508,__l,(allocator_type *)this_00);
  std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>(&local_4f0,&local_508);
  kratos::Simulator::set((Simulator *)local_4c8,pVVar4,&local_4f0,true);
  std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~optional(&local_4f0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_508);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             &res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>.field_0xf);
  oVar7 = kratos::Simulator::get((Simulator *)local_4c8,(Var *)local_278);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  local_549 = std::operator==(&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_548,&local_549,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar1) {
    testing::Message::Message(&local_558);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_580,(internal *)local_548,(AssertionResult *)"res == std::nullopt","false",
               "true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_560,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x98,pcVar6);
    testing::internal::AssertHelper::operator=(&local_560,&local_558);
    testing::internal::AssertHelper::~AssertHelper(&local_560);
    std::__cxx11::string::~string((string *)&local_580);
    testing::Message::~Message(&local_558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  pVVar4 = local_178;
  local_594 = 1;
  std::optional<unsigned_long>::optional<int,_true>((optional<unsigned_long> *)local_590,&local_594)
  ;
  oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = 0;
  oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)local_590._0_8_;
  oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_590[8];
  oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_3_ = local_590._9_3_;
  kratos::Simulator::set((Simulator *)local_4c8,pVVar4,oVar7,true);
  kratos::Simulator::eval((Simulator *)local_4c8);
  oVar7 = kratos::Simulator::get((Simulator *)local_4c8,(Var *)local_278);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  uStack_5a0 = CONCAT31(uStack_5a0._1_3_,
                        oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._M_engaged);
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_4_ = uStack_5a0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       gtest_ar__1.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  local_5b9 = std::operator==(&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5b8,&local_5b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b8);
  if (!bVar1) {
    testing::Message::Message(&local_5c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5f0,(internal *)local_5b8,(AssertionResult *)"res == std::nullopt","false",
               "true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x9d,pcVar6);
    testing::internal::AssertHelper::operator=(&local_5d0,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    std::__cxx11::string::~string((string *)&local_5f0);
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
  pVVar4 = local_178;
  local_604 = 0;
  std::optional<unsigned_long>::optional<int,_true>((optional<unsigned_long> *)local_600,&local_604)
  ;
  value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = 0;
  value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)local_600._0_8_;
  value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_600[8];
  value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_3_ = local_600._9_3_;
  kratos::Simulator::set((Simulator *)local_4c8,pVVar4,value_00,true);
  pVVar4 = local_178;
  local_61c = 1;
  std::optional<unsigned_long>::optional<int,_true>((optional<unsigned_long> *)local_618,&local_61c)
  ;
  value_01.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = 0;
  value_01.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)local_618._0_8_;
  value_01.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_618[8];
  value_01.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_3_ = local_618._9_3_;
  kratos::Simulator::set((Simulator *)local_4c8,pVVar4,value_01,true);
  oVar7 = kratos::Simulator::get((Simulator *)local_4c8,(Var *)local_278);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  uStack_628 = CONCAT31(uStack_628._1_3_,
                        oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._M_engaged);
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_4_ = uStack_628;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       gtest_ar__2.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  local_641 = std::operator!=(&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_640,&local_641,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(&local_650);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_640,
               (AssertionResult *)"res != std::nullopt","false","true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0xa2,pcVar6);
    testing::internal::AssertHelper::operator=(&local_658,&local_650);
    testing::internal::AssertHelper::~AssertHelper(&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_650);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  lhs = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&gtest_ar_.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_688,"*res","value",lhs,&local_4cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
  if (!bVar1) {
    testing::Message::Message(&local_690);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_688);
    testing::internal::AssertHelper::AssertHelper
              (&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0xa3,pcVar6);
    testing::internal::AssertHelper::operator=(&local_698,&local_690);
    testing::internal::AssertHelper::~AssertHelper(&local_698);
    testing::Message::~Message(&local_690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
  kratos::Simulator::~Simulator((Simulator *)local_4c8);
  std::shared_ptr<kratos::SequentialStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::SequentialStmtBlock> *)local_2b0);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(sim, sequential) {  // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &clk = mod.var("clk", 1);
    auto &a = mod.var("a", 4, {2, 2});
    auto &b = mod.var("b", 4, {2, 2});
    auto &c = mod.var("c", 4);
    auto seq = mod.sequential();
    seq->add_condition({EventEdgeType::Posedge, clk.shared_from_this()});
    seq->add_stmt(c.assign(a[1][1]));
    seq->add_stmt(a.assign(b));

    Simulator sim(&mod);
    uint32_t constexpr value = 5;
    sim.set(&(b[1][1]), std::vector<uint64_t>{value});
    auto res = sim.get(&c);
    // should be null value
    EXPECT_TRUE(res == std::nullopt);

    sim.set(&clk, 1);
    sim.eval();
    res = sim.get(&c);
    EXPECT_TRUE(res == std::nullopt);

    sim.set(&clk, 0);
    sim.set(&clk, 1);
    res = sim.get(&c);
    EXPECT_TRUE(res != std::nullopt);
    EXPECT_EQ(*res, value);
}